

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::GetExperimentalJavaFieldTypeForSingular
              (FieldDescriptor *field)

{
  Type TVar1;
  int result;
  FieldDescriptor *unaff_retaddr;
  undefined4 local_4;
  
  TVar1 = FieldDescriptor::type(unaff_retaddr);
  if (TVar1 == TYPE_GROUP) {
    local_4 = 0x11;
  }
  else if ((int)TVar1 < 10) {
    local_4 = TVar1 - TYPE_DOUBLE;
  }
  else {
    local_4 = TVar1 - TYPE_FLOAT;
  }
  return local_4;
}

Assistant:

int GetExperimentalJavaFieldTypeForSingular(const FieldDescriptor* field) {
  // j/c/g/protobuf/FieldType.java lists field types in a slightly different
  // order from FieldDescriptor::Type so we can't do a simple cast.
  //
  // TODO(xiaofeng): Make j/c/g/protobuf/FieldType.java follow the same order.
  int result = field->type();
  if (result == FieldDescriptor::TYPE_GROUP) {
    return 17;
  } else if (result < FieldDescriptor::TYPE_GROUP) {
    return result - 1;
  } else {
    return result - 2;
  }
}